

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GPUShaderFP64Test7::buildTestProgram(GPUShaderFP64Test7 *this,_variables *variables)

{
  ostringstream *this_00;
  GLint GVar1;
  code *pcVar2;
  pointer p_Var3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  undefined4 extraout_var;
  ostream *poVar9;
  long lVar10;
  long lVar11;
  GLint link_status;
  pointer local_410;
  long local_408;
  long local_400;
  string vs_body;
  string te_body;
  string tc_body;
  string gs_body;
  string fs_body;
  char *local_358 [4];
  stringstream attribute_name_sstream;
  ostringstream local_330 [8];
  ostream local_328;
  undefined1 local_1b0 [384];
  long lVar8;
  
  getFragmentShaderBody_abi_cxx11_(&fs_body,this,variables);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  getGeometryShaderBody_abi_cxx11_(&gs_body,this,variables);
  getTessellationControlShaderBody_abi_cxx11_(&tc_body,this,variables);
  getTessellationEvaluationShaderBody_abi_cxx11_(&te_body,this,variables);
  getVertexShaderBody_abi_cxx11_(&vs_body,this,variables);
  link_status = 0;
  bVar4 = compileShader(this,this->m_fs_id,&fs_body);
  if (bVar4) {
    bVar4 = compileShader(this,this->m_gs_id,&gs_body);
    if (bVar4) {
      bVar4 = compileShader(this,this->m_tc_id,&tc_body);
      if (bVar4) {
        bVar4 = compileShader(this,this->m_te_id,&te_body);
        if (bVar4) {
          bVar4 = compileShader(this,this->m_vs_id,&vs_body);
          if (bVar4) {
            releaseXFBVaryingNames(this);
            generateXFBVaryingNames(this,variables);
            (**(code **)(lVar8 + 0x14c8))
                      (this->m_po_id,this->m_n_xfb_varyings,this->m_xfb_varyings,0x8c8c);
            (**(code **)(lVar8 + 0xce8))(this->m_po_id);
            dVar6 = (**(code **)(lVar8 + 0x800))();
            glu::checkError(dVar6,
                            "Either glTransformFeedbackVaryings() or glLinkProgram() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                            ,0x22f1);
            (**(code **)(lVar8 + 0x9d8))(this->m_po_id,0x8b82,&link_status);
            dVar6 = (**(code **)(lVar8 + 0x800))();
            glu::checkError(dVar6,"glGetProgramiv() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                            ,0x22f4);
            if (link_status == 1) {
              if (this->m_are_double_inputs_supported == true) {
                local_408 = ((long)(variables->
                                   super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(variables->
                                  super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                                  )._M_impl.super__Vector_impl_data._M_start) / 0xc;
                lVar10 = 0;
                lVar11 = 0;
                while (local_408 != lVar11) {
                  local_410 = (variables->
                              super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                  std::__cxx11::stringstream::stringstream((stringstream *)&attribute_name_sstream);
                  poVar9 = std::operator<<(&local_328,"in_vs_variable");
                  std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                  if (1 < *(uint *)((long)&local_410->array_size + lVar10)) {
                    std::operator<<(&local_328,"[0]");
                  }
                  pcVar2 = *(code **)(lVar8 + 0x780);
                  GVar1 = this->m_po_id;
                  local_400 = lVar11;
                  std::__cxx11::stringbuf::str();
                  uVar7 = (*pcVar2)(GVar1,local_1b0._0_8_);
                  p_Var3 = local_410;
                  *(undefined4 *)((long)&local_410->attribute_location + lVar10) = uVar7;
                  std::__cxx11::string::~string((string *)local_1b0);
                  if (*(int *)((long)&p_Var3->attribute_location + lVar10) == -1) {
                    local_1b0._0_8_ =
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                    this_00 = (ostringstream *)(local_1b0 + 8);
                    std::__cxx11::ostringstream::ostringstream(this_00);
                    std::operator<<((ostream *)this_00,"Input double-precision attribute named [");
                    std::__cxx11::stringbuf::str();
                    std::operator<<((ostream *)this_00,local_358[0]);
                    std::operator<<((ostream *)this_00,"] is considered inactive which is invalid.")
                    ;
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_1b0,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    std::__cxx11::string::~string((string *)local_358);
                    std::__cxx11::ostringstream::~ostringstream(this_00);
                    this->m_has_test_passed = false;
                    std::__cxx11::stringstream::~stringstream
                              ((stringstream *)&attribute_name_sstream);
                    goto LAB_009e66e4;
                  }
                  std::__cxx11::stringstream::~stringstream((stringstream *)&attribute_name_sstream)
                  ;
                  lVar10 = lVar10 + 0xc;
                  lVar11 = local_400 + 1;
                }
              }
              std::__cxx11::string::_M_assign((string *)&this->m_current_fs_body);
              std::__cxx11::string::_M_assign((string *)&this->m_current_gs_body);
              std::__cxx11::string::_M_assign((string *)&this->m_current_tc_body);
              std::__cxx11::string::_M_assign((string *)&this->m_current_te_body);
              bVar4 = true;
              std::__cxx11::string::_M_assign((string *)&this->m_current_vs_body);
              goto LAB_009e66e6;
            }
            _attribute_name_sstream =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream(local_330);
            std::operator<<((ostream *)local_330,"A valid program object failed to link.");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&attribute_name_sstream,
                       (EndMessageToken *)&tcu::TestLog::EndMessage);
          }
          else {
            _attribute_name_sstream =
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream(local_330);
            std::operator<<((ostream *)local_330,"Vertex shader failed to compile.");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&attribute_name_sstream,
                       (EndMessageToken *)&tcu::TestLog::EndMessage);
          }
        }
        else {
          _attribute_name_sstream =
               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(local_330);
          std::operator<<((ostream *)local_330,"Tessellation evaluation shader failed to compile.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&attribute_name_sstream,
                     (EndMessageToken *)&tcu::TestLog::EndMessage);
        }
      }
      else {
        _attribute_name_sstream =
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(local_330);
        std::operator<<((ostream *)local_330,"Tessellation control shader failed to compile.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&attribute_name_sstream,
                   (EndMessageToken *)&tcu::TestLog::EndMessage);
      }
    }
    else {
      _attribute_name_sstream =
           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(local_330);
      std::operator<<((ostream *)local_330,"Geometry shader failed to compile.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&attribute_name_sstream,
                 (EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  else {
    _attribute_name_sstream =
         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_330);
    std::operator<<((ostream *)local_330,"Fragment shader failed to compile.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&attribute_name_sstream,
               (EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream(local_330);
LAB_009e66e4:
  bVar4 = false;
LAB_009e66e6:
  std::__cxx11::string::~string((string *)&vs_body);
  std::__cxx11::string::~string((string *)&te_body);
  std::__cxx11::string::~string((string *)&tc_body);
  std::__cxx11::string::~string((string *)&gs_body);
  std::__cxx11::string::~string((string *)&fs_body);
  return bVar4;
}

Assistant:

bool GPUShaderFP64Test7::buildTestProgram(_variables& variables)
{
	std::string			  fs_body = getFragmentShaderBody(variables);
	const glw::Functions& gl	  = m_context.getRenderContext().getFunctions();
	std::string			  gs_body = getGeometryShaderBody(variables);
	std::string			  tc_body = getTessellationControlShaderBody(variables);
	std::string			  te_body = getTessellationEvaluationShaderBody(variables);
	std::string			  vs_body = getVertexShaderBody(variables);
	bool				  result  = false;

	/* Try to link the program object */
	glw::GLint link_status = GL_FALSE;

	/* Compile the shaders */
	if (!compileShader(m_fs_id, fs_body))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Fragment shader failed to compile." << tcu::TestLog::EndMessage;

		goto end;
	}

	if (!compileShader(m_gs_id, gs_body))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Geometry shader failed to compile." << tcu::TestLog::EndMessage;

		goto end;
	}

	if (!compileShader(m_tc_id, tc_body))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Tessellation control shader failed to compile."
						   << tcu::TestLog::EndMessage;

		goto end;
	}

	if (!compileShader(m_te_id, te_body))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Tessellation evaluation shader failed to compile."
						   << tcu::TestLog::EndMessage;

		goto end;
	}

	if (!compileShader(m_vs_id, vs_body))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex shader failed to compile." << tcu::TestLog::EndMessage;

		goto end;
	}

	/* Configure XFB */
	releaseXFBVaryingNames();
	generateXFBVaryingNames(variables);

	gl.transformFeedbackVaryings(m_po_id, m_n_xfb_varyings, m_xfb_varyings, GL_INTERLEAVED_ATTRIBS);

	gl.linkProgram(m_po_id);

	/* Have we succeeded? */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Either glTransformFeedbackVaryings() or glLinkProgram() call failed.");

	gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_TRUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "A valid program object failed to link."
						   << tcu::TestLog::EndMessage;

		goto end;
	}

	/* Retrieve attribute locations *if* GL_ARB_vertex_attrib_64bit is supported */
	if (m_are_double_inputs_supported)
	{
		const size_t n_variables = variables.size();

		for (size_t n_variable = 0; n_variable < n_variables; ++n_variable)
		{
			_variable&		  current_variable = variables[n_variable];
			std::stringstream attribute_name_sstream;

			attribute_name_sstream << "in_vs_variable" << n_variable;

			if (current_variable.array_size > 1)
			{
				attribute_name_sstream << "[0]";
			}

			current_variable.attribute_location = gl.getAttribLocation(m_po_id, attribute_name_sstream.str().c_str());

			if (current_variable.attribute_location == -1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Input double-precision attribute named ["
								   << attribute_name_sstream.str().c_str()
								   << "] is considered inactive which is invalid." << tcu::TestLog::EndMessage;

				m_has_test_passed = false;
				goto end;
			}
		} /* for (all test variables) */
	}	 /* if (m_are_double_inputs_supported) */

	m_current_fs_body = fs_body;
	m_current_gs_body = gs_body;
	m_current_tc_body = tc_body;
	m_current_te_body = te_body;
	m_current_vs_body = vs_body;

	result = true;

end:
	return result;
}